

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

void structDeclaration(void)

{
  object *poVar1;
  typeDesc *ptVar2;
  typeDesc *ptVar3;
  char *msg;
  
  if (currentSymbol == 0x268) {
    getSymbol();
    if (currentSymbol == 0x1f5) {
      poVar1 = newObj(0x2bf);
      getSymbol();
      if (currentSymbol == 0x132) {
        ptVar2 = (typeDesc *)0x0;
LAB_001057b1:
        getSymbol();
        semicolon();
        ptVar2->fields = topScope->next;
        topScope = topScope->dsc;
        return;
      }
      if (currentSymbol == 0x131) {
        getSymbol();
        if (currentSymbol == 0x132) {
          msg = "declaration of empty struct not allowed";
        }
        else {
          ptVar2 = newType();
          ptVar2->form = 0x323;
          ptVar2->size = 0;
          poVar1->typeIndex = ptVar2->index;
          ptVar3 = newType();
          ptVar3->form = 0x324;
          ptVar3->size = 4;
          ptVar3->base = ptVar2;
          ptVar2->refIndex = ptVar3->index;
          openScope();
          while (currentSymbol == 0x267) {
            getSymbol();
            poVar1 = variableDeclaration(0x2be);
            poVar1->val = ptVar2->size;
            ptVar3 = getType(poVar1->typeIndex);
            ptVar2->size = ptVar2->size + ptVar3->size;
          }
          if (currentSymbol == 0x132) goto LAB_001057b1;
          msg = "bad variable declaration";
        }
      }
      else {
        msg = "missing right curly bracket in struct declaration";
      }
    }
    else {
      msg = "missing struct identifier";
    }
  }
  else {
    msg = "missing struct keyword";
  }
  mark(msg);
  exit(-1);
}

Assistant:

procedure 
void structDeclaration(void) {
	variable struct object *tmpObj; variable struct object *obj;
	variable struct typeDesc *tmpType; variable struct typeDesc *type; variable struct typeDesc *ref;
	ref = NULL; obj = NULL; type = NULL; tmpObj = NULL; tmpType = NULL;
	if (currentSymbol == SYMBOL_STRUCT) {
		getSymbol();		
		if (currentSymbol == SYMBOL_IDENTIFIER) {
			obj = newObj(CLASS_TYP);
			getSymbol();
			if (currentSymbol == SYMBOL_CLBRAK) {
				getSymbol();
				if (currentSymbol == SYMBOL_CRBRAK) {
					mark("declaration of empty struct not allowed");
					exit(-1);
				}
				type = newType(); 	/* rec. type */
				type->form = FORM_RECORD; type->size = 0;	
				obj->typeIndex = type->index;
				ref = newType(); 	/* ref. to rec. */
				ref->form = FORM_REF; 
				ref->size = wordSize; 
				ref->base = type; 
				type->refIndex = ref->index;
				openScope();
				while (currentSymbol == SYMBOL_VAR) {
					getSymbol();
					tmpObj = variableDeclaration(CLASS_FLD);
					tmpObj->val = type->size;
					tmpType = getType(tmpObj->typeIndex);
					type->size = type->size + tmpType->size;
				}
				if (currentSymbol != SYMBOL_CRBRAK) {
					mark("bad variable declaration");
					exit(-1);
				}
			}
			if (currentSymbol == SYMBOL_CRBRAK){
				getSymbol();
			} else {
				mark("missing right curly bracket in struct declaration");
				exit(-1);
			}
			semicolon();
		} else {
			mark("missing struct identifier");
			exit(-1);
		}
		type->fields = topScope->next;
		closeScope();
	} else {
		mark("missing struct keyword");
		exit(-1);
	}
}